

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void deqp::gls::FboUtil::config::glInitLayered
               (TextureLayered *cfg,GLint depth_divider,Functions *gl)

{
  glTexImage3DFunc p_Var1;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TransferFormat TVar6;
  int iVar7;
  GLint level;
  int iVar8;
  
  TVar6 = transferImageFormat((ImageFormat *)(cfg + 8));
  iVar3 = *(int *)(cfg + 0x10);
  iVar4 = *(int *)(cfg + 0x14);
  iVar5 = *(int *)(cfg + 0x1c);
  for (iVar8 = 0; iVar8 < *(int *)(cfg + 0x18); iVar8 = iVar8 + 1) {
    p_Var1 = gl->texImage3D;
    GVar2 = glTarget((Image *)cfg);
    (*p_Var1)(GVar2,iVar8,*(GLint *)(cfg + 8),iVar3,iVar4,iVar5,0,TVar6.format,TVar6.dataType,
              (void *)0x0);
    iVar3 = iVar3 / 2;
    iVar7 = 1;
    if (iVar3 < 2) {
      iVar3 = iVar7;
    }
    iVar4 = iVar4 / 2;
    if (iVar4 < 2) {
      iVar4 = iVar7;
    }
    iVar5 = iVar5 / depth_divider;
    if (iVar5 < 2) {
      iVar5 = iVar7;
    }
  }
  return;
}

Assistant:

static void glInitLayered (const TextureLayered& cfg,
						   GLint depth_divider, const glw::Functions& gl)
{
	const TransferFormat format = transferImageFormat(cfg.internalFormat);
	GLint w = cfg.width;
	GLint h = cfg.height;
	GLint depth = cfg.numLayers;
	for (GLint level = 0; level < cfg.numLevels; level++)
	{
		gl.texImage3D(glTarget(cfg), level, cfg.internalFormat.format, w, h, depth, 0,
					  format.format, format.dataType, DE_NULL);
		w = de::max(1, w / 2);
		h = de::max(1, h / 2);
		depth = de::max(1, depth / depth_divider);
	}
}